

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_arkstep_io.c
# Opt level: O2

int ARKStepGetNumNonlinSolvIters(void *arkode_mem,long *nniters)

{
  int iVar1;
  ARKodeARKStepMem step_mem;
  ARKodeMem ark_mem;
  ARKodeARKStepMem local_18;
  ARKodeMem local_10;
  
  iVar1 = arkStep_AccessStepMem(arkode_mem,"ARKStepGetNumNonlinSolvIters",&local_10,&local_18);
  if (iVar1 == 0) {
    *nniters = local_18->nls_iters;
  }
  return iVar1;
}

Assistant:

int ARKStepGetNumNonlinSolvIters(void *arkode_mem, long int *nniters)
{
  ARKodeMem ark_mem;
  ARKodeARKStepMem step_mem;
  int retval;

  /* access ARKodeARKStepMem structure */
  retval = arkStep_AccessStepMem(arkode_mem, "ARKStepGetNumNonlinSolvIters",
                                 &ark_mem, &step_mem);
  if (retval != ARK_SUCCESS)  return(retval);

  *nniters = step_mem->nls_iters;

  return(ARK_SUCCESS);
}